

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::~raft_server(raft_server *this)

{
  EventAwaiter *pEVar1;
  unique_lock<std::mutex> commit_lock;
  unique_lock<std::mutex> lock;
  unique_lock<std::recursive_mutex> guard;
  unique_lock<std::mutex> local_58;
  unique_lock<std::mutex> local_48;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  unique_lock<std::recursive_mutex> local_30;
  
  this->_vptr_raft_server = (_func_int **)&PTR__raft_server_005c6d80;
  cancel_global_requests(this);
  std::unique_lock<std::recursive_mutex>::unique_lock(&local_30,&this->lock_);
  LOCK();
  (this->stopping_)._M_base._M_i = true;
  UNLOCK();
  std::unique_lock<std::mutex>::unique_lock(&local_58,&this->commit_cv_lock_);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::unique_lock(&local_48,&this->ready_to_stop_cv_lock_);
  std::unique_lock<std::mutex>::unlock(&local_58);
  local_58._M_device = (mutex_type *)0x0;
  local_58._M_owns = false;
  local_38.__r = 10;
  std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
            (&this->ready_to_stop_cv_,&local_48,&local_38);
  cancel_schedulers(this);
  pEVar1 = this->bg_append_ea_;
  if (pEVar1 != (EventAwaiter *)0x0) {
    std::condition_variable::~condition_variable(&pEVar1->cv);
  }
  operator_delete(pEVar1);
  pEVar1 = this->ea_sm_commit_exec_in_progress_;
  if (pEVar1 != (EventAwaiter *)0x0) {
    std::condition_variable::~condition_variable(&pEVar1->cv);
  }
  operator_delete(pEVar1);
  pEVar1 = this->ea_follower_log_append_;
  if (pEVar1 != (EventAwaiter *)0x0) {
    std::condition_variable::~condition_variable(&pEVar1->cv);
  }
  operator_delete(pEVar1);
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  std::unique_lock<std::mutex>::~unique_lock(&local_58);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->last_snapshot_).
              super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base(&(this->ex_resp_handler_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->resp_handler_).super__Function_base);
  std::condition_variable::~condition_variable(&this->ready_to_stop_cv_);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  ::~_Rb_tree(&(this->commit_ret_elems_)._M_t);
  std::condition_variable::~condition_variable(&this->commit_cv_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->conf_to_add_).
              super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->uncommitted_config_).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->stale_config_).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base(&(this->rand_timeout_).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->state_machine_).
              super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::
  _List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ::_M_clear(&(this->auto_fwd_reqs_).
              super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
            );
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->auto_fwd_pkgs_)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::rpc_client>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->rpc_clients_)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->peers_)._M_h);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->election_task_).
              super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base(&(this->election_exec_).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->scheduler_).
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::~unique_ptr(&this->ctx_);
  std::thread::~thread(&this->bg_append_thread_);
  std::thread::~thread(&this->bg_commit_thread_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
              super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

raft_server::~raft_server() {
    // For the case that user does not call shutdown() and directly
    // destroy the current `raft_server` instance.
    cancel_global_requests();

    recur_lock(lock_);
    stopping_ = true;
    std::unique_lock<std::mutex> commit_lock(commit_cv_lock_);
    commit_cv_.notify_all();
    std::unique_lock<std::mutex> lock(ready_to_stop_cv_lock_);
    commit_lock.unlock();
    commit_lock.release();
    ready_to_stop_cv_.wait_for(lock, std::chrono::milliseconds(10));
    cancel_schedulers();
    delete bg_append_ea_;
    delete ea_sm_commit_exec_in_progress_;
    delete ea_follower_log_append_;
}